

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
          (AsyncQueue<nrg::InstantExecution> *this,function<void_()> *param)

{
  function<void_()> local_40;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  function<void_()> *param_local;
  AsyncQueue<nrg::InstantExecution> *this_local;
  
  lock._M_device = (mutex_type *)param;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->guard_);
  std::function<void_()>::function(&local_40,(function<void_()> *)lock._M_device);
  InstantExecution::push(&this->queue_,&local_40);
  std::function<void_()>::~function(&local_40);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }